

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GenerateSetBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  anon_unknown_0::GenerateSetBitInternal(__return_storage_ptr__,&local_38,(int)this);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateSetBit(int bitIndex) {
  return GenerateSetBitInternal("", bitIndex);
}